

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.hpp
# Opt level: O0

void __thiscall deqp::gls::ShaderExecUtil::Symbol::Symbol(Symbol *this)

{
  Symbol *this_local;
  
  std::__cxx11::string::string((string *)this);
  glu::VarType::VarType(&this->varType);
  return;
}

Assistant:

Symbol (void) {}